

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenpool-gnu-make-posix.cc
# Opt level: O2

bool __thiscall GNUmakeTokenPoolPosix::ParseAuth(GNUmakeTokenPoolPosix *this,char *jobserver)

{
  bool bVar1;
  int iVar2;
  int wfd;
  int rfd;
  
  iVar2 = __isoc99_sscanf(jobserver,"%*[^=]=%d,%d");
  if ((((iVar2 == 2) && (bVar1 = CheckFd((GNUmakeTokenPoolPosix *)jobserver,-1), bVar1)) &&
      (bVar1 = CheckFd((GNUmakeTokenPoolPosix *)jobserver,-1), bVar1)) &&
     (bVar1 = SetAlarmHandler(this), bVar1)) {
    this->rfd_ = -1;
    this->wfd_ = -1;
    return true;
  }
  return false;
}

Assistant:

bool GNUmakeTokenPoolPosix::ParseAuth(const char* jobserver) {
  int rfd = -1;
  int wfd = -1;
  if ((sscanf(jobserver, "%*[^=]=%d,%d", &rfd, &wfd) == 2) &&
      CheckFd(rfd) &&
      CheckFd(wfd) &&
      SetAlarmHandler()) {
    rfd_ = rfd;
    wfd_ = wfd;
    return true;
  }

  return false;
}